

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::NodeLoader::end__instance_geometry(NodeLoader *this)

{
  long in_RDI;
  Array<COLLADAFW::MaterialBinding> *in_stack_00000008;
  
  COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>::getMaterialBindings
            (*(InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> **)(in_RDI + 0x60));
  IFilePartLoader::
  copyStlContainerToArray<std::set<COLLADAFW::MaterialBinding,std::less<COLLADAFW::MaterialBinding>,std::allocator<COLLADAFW::MaterialBinding>>,COLLADAFW::Array<COLLADAFW::MaterialBinding>>
            ((set<COLLADAFW::MaterialBinding,_std::less<COLLADAFW::MaterialBinding>,_std::allocator<COLLADAFW::MaterialBinding>_>
              *)this,in_stack_00000008);
  *(undefined8 *)(in_RDI + 0x60) = 0;
  endInstanceWithMaterial((NodeLoader *)0xc43078);
  return true;
}

Assistant:

bool NodeLoader::end__instance_geometry()
	{
        FilePartLoader::copyStlContainerToArray( mCurrentMaterialBindings, mCurrentInstanceGeometry->getMaterialBindings());
        mCurrentInstanceGeometry = 0;
        endInstanceWithMaterial();

        return true;
	}